

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

void av1_set_mb_ur_variance(AV1_COMP *cpi)

{
  AV1_COMP *pAVar1;
  AV1_COMP *pAVar2;
  int iVar3;
  int iVar4;
  long in_RDI;
  double dVar5;
  double dVar6;
  double delta_q;
  int index_1;
  int col_1;
  int row_1;
  double new_delta_q_avg;
  int cq_level;
  double scaling_factor;
  int model_idx;
  uint block_variance;
  int col_offset_y;
  int row_offset_y;
  buf_2d buf;
  int mi_col;
  int mi_row;
  int index;
  double num_of_var;
  double var;
  int col;
  int row;
  int delta_q_avg [2];
  double c [2];
  double b [2];
  double a [2];
  double model_change [2];
  int *mb_delta_q [2];
  int num_rows;
  int num_cols;
  int num_mi_h;
  int num_mi_w;
  int block_size;
  int y_stride;
  uint8_t *y_buffer;
  MACROBLOCKD *xd;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  int in_stack_fffffffffffffe78;
  BLOCK_SIZE in_stack_fffffffffffffe7f;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  AV1_COMP *in_stack_fffffffffffffe90;
  int local_15c;
  int local_13c;
  uint local_130;
  int local_118;
  int local_114;
  double local_100;
  int local_f8;
  int local_c4;
  double dVar7;
  double dVar8;
  int local_a8;
  int local_a4;
  int local_a0 [2];
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  AV1_COMP *local_70;
  undefined8 local_68;
  undefined8 local_60;
  void *local_58 [3];
  int local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  undefined4 local_2c;
  undefined8 local_28;
  long local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_10 = in_RDI + 0x3bf80;
  local_18 = in_RDI + 0x3c188;
  local_20 = in_RDI + 0x151d0;
  local_28 = *(undefined8 *)(*(long *)(in_RDI + 0x427a8) + 0x28);
  local_2c = *(undefined4 *)(*(long *)(in_RDI + 0x427a8) + 0x20);
  local_30 = (uint)*(byte *)(*(long *)(in_RDI + 0x42008) + 0x1c);
  local_34 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [(int)local_30];
  local_38 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [(int)local_30];
  local_3c = (int)(*(int *)(in_RDI + 0x3c198) + local_34 + -1) / (int)local_34;
  local_40 = (int)(*(int *)(in_RDI + 0x3c194) + local_38 + -1) / (int)local_38;
  local_8 = in_RDI;
  local_58[0] = aom_calloc(CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  if (local_58[0] == (void *)0x0) {
    aom_internal_error(*(aom_internal_error_info **)(local_10 + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate mb_delta_q[0]");
  }
  local_58[1] = aom_calloc(CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  if (local_58[1] == (void *)0x0) {
    aom_internal_error(*(aom_internal_error_info **)(local_10 + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate mb_delta_q[1]");
  }
  local_68 = 0x4008000000000000;
  local_60 = 0x4008000000000000;
  local_78 = -98.0;
  local_70 = (AV1_COMP *)0xc051333333333333;
  local_88 = 0.004898;
  local_80 = 0.003093;
  local_98 = 131.728;
  local_90 = 180.4;
  memset(local_a0,0,8);
  for (local_a4 = 0; local_a4 < local_40; local_a4 = local_a4 + 1) {
    for (local_a8 = 0; local_a8 < local_3c; local_a8 = local_a8 + 1) {
      dVar8 = 0.0;
      dVar7 = 0.0;
      iVar3 = local_a4 * local_3c + local_a8;
      for (iVar4 = local_a4 * local_38;
          iVar4 < *(int *)(local_18 + 0xc) && iVar4 < (int)((local_a4 + 1) * local_38);
          iVar4 = iVar4 + 2) {
        for (local_c4 = local_a8 * local_34;
            local_c4 < *(int *)(local_18 + 0x10) && local_c4 < (int)((local_a8 + 1) * local_34);
            local_c4 = local_c4 + 2) {
          local_130 = av1_get_perpixel_variance_facade
                                (in_stack_fffffffffffffe90,
                                 (MACROBLOCKD *)
                                 CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                 (buf_2d *)
                                 CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                                 in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78);
          if (local_130 < 2) {
            local_130 = 1;
          }
          dVar5 = log((double)local_130);
          dVar8 = dVar5 + dVar8;
          dVar7 = dVar7 + 1.0;
        }
      }
      dVar5 = exp(dVar8 / dVar7);
      dVar8 = local_78;
      dVar6 = exp(-local_88 * dVar5);
      dVar7 = local_78;
      if (0.0 <= dVar8 * dVar6 + local_98) {
        dVar8 = exp(-local_88 * dVar5);
        dVar8 = dVar7 * dVar8 + local_98 + 0.5;
      }
      else {
        dVar8 = exp(-local_88 * dVar5);
        dVar8 = (dVar7 * dVar8 + local_98) - 0.5;
      }
      pAVar1 = local_70;
      local_13c = (int)dVar8;
      *(int *)((long)local_58[0] + (long)iVar3 * 4) = local_13c;
      dVar8 = exp(-local_80 * dVar5);
      pAVar2 = local_70;
      if (0.0 <= (double)pAVar1 * dVar8 + local_90) {
        in_stack_fffffffffffffe90 = local_70;
        dVar8 = exp(-local_80 * dVar5);
        dVar8 = (double)in_stack_fffffffffffffe90 * dVar8 + local_90 + 0.5;
      }
      else {
        dVar8 = exp(-local_80 * dVar5);
        dVar8 = ((double)pAVar2 * dVar8 + local_90) - 0.5;
      }
      local_15c = (int)dVar8;
      *(int *)((long)local_58[1] + (long)iVar3 * 4) = local_15c;
      local_a0[0] = *(int *)((long)local_58[0] + (long)iVar3 * 4) + local_a0[0];
      local_a0[1] = *(int *)((long)local_58[1] + (long)iVar3 * 4) + local_a0[1];
    }
  }
  if (0.0 <= (double)local_a0[0] / (double)(local_40 * local_3c)) {
    dVar8 = (double)local_a0[0] / (double)(local_40 * local_3c) + 0.5;
  }
  else {
    dVar8 = (double)local_a0[0] / (double)(local_40 * local_3c) - 0.5;
  }
  local_a0[0] = (int)dVar8;
  if (0.0 <= (double)local_a0[1] / (double)(local_40 * local_3c)) {
    dVar8 = (double)local_a0[1] / (double)(local_40 * local_3c) + 0.5;
  }
  else {
    dVar8 = (double)local_a0[1] / (double)(local_40 * local_3c) - 0.5;
  }
  local_a0[1] = (int)dVar8;
  iVar3 = *(int *)(local_8 + 0x423d8);
  if (iVar3 < local_a0[0]) {
    local_f8 = 0;
    local_100 = (double)iVar3 / (double)local_a0[0];
  }
  else if (iVar3 < local_a0[1]) {
    local_f8 = 2;
    local_100 = (double)(iVar3 - local_a0[0]) / (double)(local_a0[1] - local_a0[0]);
  }
  else {
    local_f8 = 1;
    local_100 = (double)(0xff - iVar3) / (double)(0xff - local_a0[1]);
  }
  dVar8 = local_100 * (double)(local_a0[1] - local_a0[0]) + (double)local_a0[0];
  for (local_114 = 0; local_114 < local_40; local_114 = local_114 + 1) {
    for (local_118 = 0; local_118 < local_3c; local_118 = local_118 + 1) {
      iVar3 = local_114 * local_3c + local_118;
      if (local_f8 == 2) {
        iVar4 = *(int *)((long)local_58[0] + (long)iVar3 * 4);
        dVar7 = local_100 * (double)(*(int *)((long)local_58[1] + (long)iVar3 * 4) - iVar4) +
                (double)iVar4;
        if (0.0 <= ((double)*(byte *)(local_8 + 0x42402) / 100.0) * (dVar7 - dVar8)) {
          dVar7 = ((double)*(byte *)(local_8 + 0x42402) / 100.0) * (dVar7 - dVar8) + 0.5;
        }
        else {
          dVar7 = ((double)*(byte *)(local_8 + 0x42402) / 100.0) * (dVar7 - dVar8) + -0.5;
        }
        in_stack_fffffffffffffe84 = (int)dVar7;
        *(int *)(*(long *)(local_8 + 0x9d608) + (long)iVar3 * 4) = in_stack_fffffffffffffe84;
      }
      else {
        if (0.0 <= ((double)*(byte *)(local_8 + 0x42402) / 100.0) * local_100 *
                   (double)(*(int *)((long)local_58[local_f8] + (long)iVar3 * 4) -
                           local_a0[local_f8])) {
          dVar7 = ((double)*(byte *)(local_8 + 0x42402) / 100.0) * local_100 *
                  (double)(*(int *)((long)local_58[local_f8] + (long)iVar3 * 4) - local_a0[local_f8]
                          ) + 0.5;
        }
        else {
          dVar7 = ((double)*(byte *)(local_8 + 0x42402) / 100.0) * local_100 *
                  (double)(*(int *)((long)local_58[local_f8] + (long)iVar3 * 4) - local_a0[local_f8]
                          ) + -0.5;
        }
        in_stack_fffffffffffffe80 = (int)dVar7;
        *(int *)(*(long *)(local_8 + 0x9d608) + (long)iVar3 * 4) = in_stack_fffffffffffffe80;
      }
    }
  }
  aom_free((void *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  aom_free((void *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  return;
}

Assistant:

void av1_set_mb_ur_variance(AV1_COMP *cpi) {
  const AV1_COMMON *cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const MACROBLOCKD *const xd = &cpi->td.mb.e_mbd;
  uint8_t *y_buffer = cpi->source->y_buffer;
  const int y_stride = cpi->source->y_stride;
  const int block_size = cpi->common.seq_params->sb_size;

  const int num_mi_w = mi_size_wide[block_size];
  const int num_mi_h = mi_size_high[block_size];
  const int num_cols = (mi_params->mi_cols + num_mi_w - 1) / num_mi_w;
  const int num_rows = (mi_params->mi_rows + num_mi_h - 1) / num_mi_h;

  int *mb_delta_q[2];
  CHECK_MEM_ERROR(cm, mb_delta_q[0],
                  aom_calloc(num_rows * num_cols, sizeof(*mb_delta_q[0])));
  CHECK_MEM_ERROR(cm, mb_delta_q[1],
                  aom_calloc(num_rows * num_cols, sizeof(*mb_delta_q[1])));

  // Approximates the model change between current version (Spet 2021) and the
  // baseline (July 2021).
  const double model_change[] = { 3.0, 3.0 };
  // The following parameters are fitted from user labeled data.
  const double a[] = { -24.50 * 4.0, -17.20 * 4.0 };
  const double b[] = { 0.004898, 0.003093 };
  const double c[] = { (29.932 + model_change[0]) * 4.0,
                       (42.100 + model_change[1]) * 4.0 };
  int delta_q_avg[2] = { 0, 0 };
  // Loop through each SB block.
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      double var = 0.0, num_of_var = 0.0;
      const int index = row * num_cols + col;

      // Loop through each 8x8 block.
      for (int mi_row = row * num_mi_h;
           mi_row < mi_params->mi_rows && mi_row < (row + 1) * num_mi_h;
           mi_row += 2) {
        for (int mi_col = col * num_mi_w;
             mi_col < mi_params->mi_cols && mi_col < (col + 1) * num_mi_w;
             mi_col += 2) {
          struct buf_2d buf;
          const int row_offset_y = mi_row << 2;
          const int col_offset_y = mi_col << 2;

          buf.buf = y_buffer + row_offset_y * y_stride + col_offset_y;
          buf.stride = y_stride;

          unsigned int block_variance;
          block_variance = av1_get_perpixel_variance_facade(
              cpi, xd, &buf, BLOCK_8X8, AOM_PLANE_Y);

          block_variance = AOMMAX(block_variance, 1);
          var += log((double)block_variance);
          num_of_var += 1.0;
        }
      }
      var = exp(var / num_of_var);
      mb_delta_q[0][index] = RINT(a[0] * exp(-b[0] * var) + c[0]);
      mb_delta_q[1][index] = RINT(a[1] * exp(-b[1] * var) + c[1]);
      delta_q_avg[0] += mb_delta_q[0][index];
      delta_q_avg[1] += mb_delta_q[1][index];
    }
  }

  delta_q_avg[0] = RINT((double)delta_q_avg[0] / (num_rows * num_cols));
  delta_q_avg[1] = RINT((double)delta_q_avg[1] / (num_rows * num_cols));

  int model_idx;
  double scaling_factor;
  const int cq_level = cpi->oxcf.rc_cfg.cq_level;
  if (cq_level < delta_q_avg[0]) {
    model_idx = 0;
    scaling_factor = (double)cq_level / delta_q_avg[0];
  } else if (cq_level < delta_q_avg[1]) {
    model_idx = 2;
    scaling_factor =
        (double)(cq_level - delta_q_avg[0]) / (delta_q_avg[1] - delta_q_avg[0]);
  } else {
    model_idx = 1;
    scaling_factor = (double)(MAXQ - cq_level) / (MAXQ - delta_q_avg[1]);
  }

  const double new_delta_q_avg =
      delta_q_avg[0] + scaling_factor * (delta_q_avg[1] - delta_q_avg[0]);
  for (int row = 0; row < num_rows; ++row) {
    for (int col = 0; col < num_cols; ++col) {
      const int index = row * num_cols + col;
      if (model_idx == 2) {
        const double delta_q =
            mb_delta_q[0][index] +
            scaling_factor * (mb_delta_q[1][index] - mb_delta_q[0][index]);
        cpi->mb_delta_q[index] = RINT((double)cpi->oxcf.q_cfg.deltaq_strength /
                                      100.0 * (delta_q - new_delta_q_avg));
      } else {
        cpi->mb_delta_q[index] = RINT(
            (double)cpi->oxcf.q_cfg.deltaq_strength / 100.0 * scaling_factor *
            (mb_delta_q[model_idx][index] - delta_q_avg[model_idx]));
      }
    }
  }

  aom_free(mb_delta_q[0]);
  aom_free(mb_delta_q[1]);
}